

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_msmblur.h
# Opt level: O3

void __thiscall
embree::sse2::BVHBuilderMSMBlur::
BuilderT<embree::NodeRefPtr<4>,_embree::sse2::RecalculatePrimRef<embree::TriangleMesh>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<4>::CreateAlloc,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Create,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Set,_embree::sse2::CreateMSMBlurLeaf<4,_embree::TriangleMesh,_embree::TriangleMi<4>_>,_embree::Scene::BuildProgressMonitorInterface>
::splitByGeometry(BuilderT<embree::NodeRefPtr<4>,_embree::sse2::RecalculatePrimRef<embree::TriangleMesh>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<4>::CreateAlloc,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Create,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Set,_embree::sse2::CreateMSMBlurLeaf<4,_embree::TriangleMesh,_embree::TriangleMi<4>_>,_embree::Scene::BuildProgressMonitorInterface>
                  *this,SetMB *set,SetMB *lset,SetMB *rset)

{
  BBox1f BVar1;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar2;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar3;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar4;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar5;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar6;
  unsigned_long uVar7;
  unsigned_long uVar8;
  PrimRefMB *pPVar9;
  PrimRefVector pmVar10;
  undefined8 uVar11;
  PrimRefMB *pPVar12;
  unsigned_long uVar13;
  ulong uVar14;
  size_t sVar15;
  ulong uVar16;
  ulong uVar17;
  size_t sVar18;
  ulong uVar19;
  PrimRefMB *pPVar20;
  bool bVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  undefined1 auVar26 [16];
  float fVar27;
  float fVar28;
  Vec3fa center;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  float fVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar34;
  undefined1 auVar35 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar36;
  float fVar37;
  uint uVar38;
  uint uVar39;
  float fVar40;
  float fVar41;
  float local_e0;
  float local_d8;
  float fStack_d4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_c8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_b8;
  undefined1 local_a8 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_98;
  undefined1 local_88 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_78;
  undefined1 local_68 [16];
  undefined8 local_58;
  undefined8 uStack_50;
  
  uVar7 = (set->super_PrimInfoMB).object_range._begin;
  uVar8 = (set->super_PrimInfoMB).object_range._end;
  pPVar9 = set->prims->items;
  pPVar12 = pPVar9 + uVar7;
  fVar23 = pPVar9[uVar7].lbounds.bounds0.lower.field_0.m128[3];
  pPVar20 = pPVar9 + uVar8;
  fVar25 = 0.0;
  fVar40 = 1.0;
  fVar31 = 1.0;
  local_e0 = 0.0;
  uVar17 = 0;
  sVar18 = 0;
  sVar15 = 0;
  local_68 = _DAT_01f7aa00;
  local_78.m128 = _DAT_01f7a9f0;
  local_88 = _DAT_01f7aa00;
  local_98.m128 = _DAT_01f7a9f0;
  local_a8 = _DAT_01f7aa00;
  local_c8.m128 = _DAT_01f7a9f0;
  local_b8.m128 = _DAT_01f7a9f0;
  uVar19 = 0;
  fVar37 = 1.0;
  fVar27 = 0.0;
  local_d8 = 0.0;
  fStack_d4 = 1.0;
  auVar32 = _DAT_01f7aa00;
  auVar33 = _DAT_01f7aa00;
  aVar34 = _DAT_01f7a9f0;
  auVar35 = _DAT_01f7aa00;
  aVar36 = _DAT_01f7a9f0;
  do {
    pPVar20 = pPVar20 + -1;
    fVar41 = fVar27;
    while ((pPVar12 <= pPVar20 && ((pPVar12->lbounds).bounds0.lower.field_0.m128[3] == fVar23))) {
      aVar2 = (pPVar12->lbounds).bounds0.lower.field_0.field_1;
      aVar3 = (pPVar12->lbounds).bounds0.upper.field_0.field_1;
      aVar4 = (pPVar12->lbounds).bounds1.lower.field_0.field_1;
      aVar5 = (pPVar12->lbounds).bounds1.upper.field_0.field_1;
      aVar34.m128 = (__m128)minps(aVar34.m128,(undefined1  [16])aVar4);
      aVar36.m128 = (__m128)minps(aVar36.m128,(undefined1  [16])aVar2);
      auVar33 = maxps(auVar33,(undefined1  [16])aVar5);
      auVar35 = maxps(auVar35,(undefined1  [16])aVar3);
      auVar26._0_4_ = aVar3.x * 0.5 + aVar5.x * 0.5 + aVar2.x * 0.5 + aVar4.x * 0.5;
      auVar26._4_4_ = aVar3.y * 0.5 + aVar5.y * 0.5 + aVar2.y * 0.5 + aVar4.y * 0.5;
      auVar26._8_4_ = aVar3.z * 0.5 + aVar5.z * 0.5 + aVar2.z * 0.5 + aVar4.z * 0.5;
      auVar26._12_4_ =
           aVar3.field_3.w * 0.5 + aVar5.field_3.w * 0.5 +
           aVar2.field_3.w * 0.5 + aVar4.field_3.w * 0.5;
      local_c8.m128 = (__m128)minps(local_c8.m128,auVar26);
      auVar32 = maxps(auVar32,auVar26);
      fVar27 = (pPVar12->time_range).lower;
      if (fVar27 <= fVar37) {
        fVar37 = fVar27;
      }
      fVar22 = (pPVar12->time_range).upper;
      fVar28 = fVar22;
      if (fVar22 <= fVar41) {
        fVar28 = fVar41;
      }
      sVar15 = sVar15 + (uint)(pPVar12->lbounds).bounds1.lower.field_0.m128[3];
      uVar14 = (ulong)(uint)(pPVar12->lbounds).bounds1.upper.field_0.m128[3];
      bVar21 = uVar19 < uVar14;
      if (uVar19 <= uVar14) {
        uVar19 = uVar14;
      }
      uVar38 = (int)((uint)bVar21 << 0x1f) >> 0x1f;
      uVar39 = (int)((uint)bVar21 << 0x1f) >> 0x1f;
      fVar25 = (float)(~uVar38 & (uint)fVar25 | (uint)fVar27 & uVar38);
      fVar40 = (float)(~uVar39 & (uint)fVar40 | (uint)fVar22 & uVar39);
      pPVar12 = pPVar12 + 1;
      fVar41 = fVar28;
    }
    uStack_50 = auVar32._8_8_;
    fVar28 = local_e0;
    while( true ) {
      if (pPVar20 < pPVar12) {
        uVar13 = ((long)pPVar12 - (long)pPVar9) / 0x50;
        pmVar10 = set->prims;
        BVar1 = (set->super_PrimInfoMB).time_range;
        (lset->super_PrimInfoMB).super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.
        lower.field_0 = aVar36;
        *(undefined1 (*) [16])
         (lset->super_PrimInfoMB).super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.
         upper.field_0.m128 = auVar35;
        (lset->super_PrimInfoMB).super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.
        lower.field_0 = aVar34;
        *(undefined1 (*) [16])
         (lset->super_PrimInfoMB).super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.
         upper.field_0.m128 = auVar33;
        *(undefined8 *)
         &(lset->super_PrimInfoMB).super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.
          field_0 = local_c8._0_8_;
        *(undefined8 *)
         ((long)&(lset->super_PrimInfoMB).super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.
                 lower.field_0 + 8) = local_c8._8_8_;
        local_58 = auVar32._0_8_;
        *(undefined8 *)
         &(lset->super_PrimInfoMB).super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.
          field_0 = local_58;
        *(undefined8 *)
         ((long)&(lset->super_PrimInfoMB).super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.
                 upper.field_0 + 8) = uStack_50;
        (lset->super_PrimInfoMB).num_time_segments = sVar15;
        (lset->super_PrimInfoMB).max_num_time_segments = uVar19;
        (lset->super_PrimInfoMB).max_time_range.lower = fVar25;
        (lset->super_PrimInfoMB).max_time_range.upper = fVar40;
        fVar23 = BVar1.lower;
        fVar25 = BVar1.upper;
        if (fVar23 <= fVar37) {
          fVar23 = fVar37;
        }
        if (fVar25 <= fVar41) {
          fVar41 = fVar25;
        }
        lset->prims = pmVar10;
        (lset->super_PrimInfoMB).object_range._begin = uVar7;
        (lset->super_PrimInfoMB).object_range._end = uVar13;
        (lset->super_PrimInfoMB).time_range.lower = fVar23;
        (lset->super_PrimInfoMB).time_range.upper = fVar41;
        pmVar10 = set->prims;
        BVar1 = (set->super_PrimInfoMB).time_range;
        *(undefined8 *)
         &(rset->super_PrimInfoMB).super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0
          .lower.field_0 = local_b8._0_8_;
        *(undefined8 *)
         ((long)&(rset->super_PrimInfoMB).super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
                 bounds0.lower.field_0 + 8) = local_b8._8_8_;
        *(undefined8 *)
         &(rset->super_PrimInfoMB).super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0
          .upper.field_0 = local_a8._0_8_;
        *(undefined8 *)
         ((long)&(rset->super_PrimInfoMB).super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
                 bounds0.upper.field_0 + 8) = local_a8._8_8_;
        *(undefined8 *)
         &(rset->super_PrimInfoMB).super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1
          .lower.field_0 = local_98._0_8_;
        *(undefined8 *)
         ((long)&(rset->super_PrimInfoMB).super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
                 bounds1.lower.field_0 + 8) = local_98._8_8_;
        *(undefined8 *)
         &(rset->super_PrimInfoMB).super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1
          .upper.field_0 = local_88._0_8_;
        *(undefined8 *)
         ((long)&(rset->super_PrimInfoMB).super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
                 bounds1.upper.field_0 + 8) = local_88._8_8_;
        *(undefined8 *)
         &(rset->super_PrimInfoMB).super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.
          field_0 = local_78._0_8_;
        *(undefined8 *)
         ((long)&(rset->super_PrimInfoMB).super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.
                 lower.field_0 + 8) = local_78._8_8_;
        *(undefined8 *)
         &(rset->super_PrimInfoMB).super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.
          field_0 = local_68._0_8_;
        *(undefined8 *)
         ((long)&(rset->super_PrimInfoMB).super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.
                 upper.field_0 + 8) = local_68._8_8_;
        (rset->super_PrimInfoMB).num_time_segments = sVar18;
        (rset->super_PrimInfoMB).max_num_time_segments = uVar17;
        (rset->super_PrimInfoMB).max_time_range.lower = local_d8;
        (rset->super_PrimInfoMB).max_time_range.upper = fStack_d4;
        fVar23 = BVar1.lower;
        fVar37 = BVar1.upper;
        if (fVar23 <= fVar31) {
          fVar23 = fVar31;
        }
        if (fVar37 <= fVar28) {
          fVar28 = fVar37;
        }
        rset->prims = pmVar10;
        (rset->super_PrimInfoMB).object_range._begin = uVar13;
        (rset->super_PrimInfoMB).object_range._end = uVar8;
        (rset->super_PrimInfoMB).time_range.lower = fVar23;
        (rset->super_PrimInfoMB).time_range.upper = fVar28;
        return;
      }
      aVar2 = (pPVar20->lbounds).bounds0.lower.field_0.field_1;
      aVar3 = (pPVar20->lbounds).bounds0.upper.field_0.field_1;
      aVar4 = (pPVar20->lbounds).bounds1.lower.field_0.field_1;
      aVar5 = (pPVar20->lbounds).bounds1.upper.field_0.field_1;
      auVar29._0_4_ = aVar3.x * 0.5 + aVar5.x * 0.5 + aVar2.x * 0.5 + aVar4.x * 0.5;
      auVar29._4_4_ = aVar3.y * 0.5 + aVar5.y * 0.5 + aVar2.y * 0.5 + aVar4.y * 0.5;
      auVar29._8_4_ = aVar3.z * 0.5 + aVar5.z * 0.5 + aVar2.z * 0.5 + aVar4.z * 0.5;
      auVar29._12_4_ =
           aVar3.field_3.w * 0.5 + aVar5.field_3.w * 0.5 +
           aVar2.field_3.w * 0.5 + aVar4.field_3.w * 0.5;
      uVar14 = (ulong)(uint)(pPVar20->lbounds).bounds1.lower.field_0.m128[3];
      uVar16 = (ulong)(uint)(pPVar20->lbounds).bounds1.upper.field_0.m128[3];
      fVar22 = (pPVar20->time_range).lower;
      fVar24 = (pPVar20->time_range).upper;
      if ((pPVar20->lbounds).bounds0.lower.field_0.m128[3] == fVar23) break;
      local_b8.m128 = (__m128)minps(local_b8.m128,(undefined1  [16])aVar2);
      local_a8 = maxps(local_a8,(undefined1  [16])aVar3);
      local_98.m128 = (__m128)minps(local_98.m128,(undefined1  [16])aVar4);
      local_88 = maxps(local_88,(undefined1  [16])aVar5);
      local_78.m128 = (__m128)minps(local_78.m128,auVar29);
      local_68 = maxps(local_68,auVar29);
      if (fVar22 <= fVar31) {
        fVar31 = fVar22;
      }
      fVar27 = fVar24;
      if (fVar24 <= fVar28) {
        fVar27 = fVar28;
      }
      sVar18 = sVar18 + uVar14;
      uVar38 = (int)((uint)(uVar17 < uVar16) << 0x1f) >> 0x1f;
      uVar39 = (int)((uint)(uVar17 < uVar16) << 0x1f) >> 0x1f;
      local_d8 = (float)(~uVar38 & (uint)local_d8 | (uint)fVar22 & uVar38);
      fStack_d4 = (float)(~uVar39 & (uint)fStack_d4 | (uint)fVar24 & uVar39);
      if (uVar17 <= uVar16) {
        uVar17 = uVar16;
      }
      pPVar20 = pPVar20 + -1;
      fVar28 = fVar27;
    }
    auVar35 = maxps(auVar35,(undefined1  [16])aVar3);
    aVar36.m128 = (__m128)minps(aVar36.m128,(undefined1  [16])aVar2);
    aVar34.m128 = (__m128)minps(aVar34.m128,(undefined1  [16])aVar4);
    auVar33 = maxps(auVar33,(undefined1  [16])aVar5);
    local_c8.m128 = (__m128)minps(local_c8.m128,auVar29);
    auVar32 = maxps(auVar32,auVar29);
    if (fVar22 <= fVar37) {
      fVar37 = fVar22;
    }
    fVar27 = fVar24;
    if (fVar24 <= fVar41) {
      fVar27 = fVar41;
    }
    sVar15 = sVar15 + uVar14;
    uVar38 = (int)((uint)(uVar19 < uVar16) << 0x1f) >> 0x1f;
    uVar39 = (int)((uint)(uVar19 < uVar16) << 0x1f) >> 0x1f;
    fVar25 = (float)(~uVar38 & (uint)fVar25 | (uint)fVar22 & uVar38);
    fVar40 = (float)(~uVar39 & (uint)fVar40 | (uint)fVar24 & uVar39);
    aVar3 = (pPVar12->lbounds).bounds0.lower.field_0.field_1;
    aVar4 = (pPVar12->lbounds).bounds0.upper.field_0.field_1;
    aVar5 = (pPVar12->lbounds).bounds1.lower.field_0.field_1;
    aVar6 = (pPVar12->lbounds).bounds1.upper.field_0.field_1;
    BVar1 = pPVar12->time_range;
    fVar41 = (pPVar12->lbounds).bounds1.lower.field_0.m128[3];
    uVar14 = (ulong)(uint)(pPVar12->lbounds).bounds1.upper.field_0.m128[3];
    (pPVar12->lbounds).bounds0.lower.field_0.field_1 = aVar2;
    uVar11 = *(undefined8 *)((long)&(pPVar20->lbounds).bounds0.upper.field_0 + 8);
    *(undefined8 *)&(pPVar12->lbounds).bounds0.upper.field_0 =
         *(undefined8 *)&(pPVar20->lbounds).bounds0.upper.field_0;
    *(undefined8 *)((long)&(pPVar12->lbounds).bounds0.upper.field_0 + 8) = uVar11;
    uVar11 = *(undefined8 *)((long)&(pPVar20->lbounds).bounds1.lower.field_0 + 8);
    *(undefined8 *)&(pPVar12->lbounds).bounds1.lower.field_0 =
         *(undefined8 *)&(pPVar20->lbounds).bounds1.lower.field_0;
    *(undefined8 *)((long)&(pPVar12->lbounds).bounds1.lower.field_0 + 8) = uVar11;
    uVar11 = *(undefined8 *)((long)&(pPVar20->lbounds).bounds1.upper.field_0 + 8);
    *(undefined8 *)&(pPVar12->lbounds).bounds1.upper.field_0 =
         *(undefined8 *)&(pPVar20->lbounds).bounds1.upper.field_0;
    *(undefined8 *)((long)&(pPVar12->lbounds).bounds1.upper.field_0 + 8) = uVar11;
    (pPVar12->time_range).lower = (pPVar20->time_range).lower;
    (pPVar12->time_range).upper = (pPVar20->time_range).upper;
    local_98.m128 = (__m128)minps(local_98.m128,(undefined1  [16])aVar5);
    (pPVar20->lbounds).bounds0.lower.field_0.field_1 = aVar3;
    (pPVar20->lbounds).bounds0.upper.field_0.field_1 = aVar4;
    (pPVar20->lbounds).bounds1.lower.field_0.field_1 = aVar5;
    local_b8.m128 = (__m128)minps(local_b8.m128,(undefined1  [16])aVar3);
    local_88 = maxps(local_88,(undefined1  [16])aVar6);
    (pPVar20->lbounds).bounds1.upper.field_0.field_1 = aVar6;
    local_a8 = maxps(local_a8,(undefined1  [16])aVar4);
    auVar30._0_4_ = aVar4.x * 0.5 + aVar6.x * 0.5 + aVar3.x * 0.5 + aVar5.x * 0.5;
    auVar30._4_4_ = aVar4.y * 0.5 + aVar6.y * 0.5 + aVar3.y * 0.5 + aVar5.y * 0.5;
    auVar30._8_4_ = aVar4.z * 0.5 + aVar6.z * 0.5 + aVar3.z * 0.5 + aVar5.z * 0.5;
    auVar30._12_4_ =
         aVar4.field_3.w * 0.5 + aVar6.field_3.w * 0.5 +
         aVar3.field_3.w * 0.5 + aVar5.field_3.w * 0.5;
    if (uVar19 <= uVar16) {
      uVar19 = uVar16;
    }
    local_78.m128 = (__m128)minps(local_78.m128,auVar30);
    local_68 = maxps(local_68,auVar30);
    fVar22 = BVar1.lower;
    if (fVar22 <= fVar31) {
      fVar31 = fVar22;
    }
    fVar24 = BVar1.upper;
    pPVar20->time_range = BVar1;
    local_e0 = fVar24;
    if (fVar24 <= fVar28) {
      local_e0 = fVar28;
    }
    sVar18 = sVar18 + (uint)fVar41;
    uVar38 = (int)((uint)(uVar17 < uVar14) << 0x1f) >> 0x1f;
    uVar39 = (int)((uint)(uVar17 < uVar14) << 0x1f) >> 0x1f;
    if (uVar17 <= uVar14) {
      uVar17 = uVar14;
    }
    local_d8 = (float)(~uVar38 & (uint)local_d8 | (uint)fVar22 & uVar38);
    fStack_d4 = (float)(~uVar39 & (uint)fStack_d4 | (uint)fVar24 & uVar39);
    pPVar12 = pPVar12 + 1;
  } while( true );
}

Assistant:

void splitByGeometry(const SetMB& set, SetMB& lset, SetMB& rset)
          {
            assert(set.size() > 1);

            mvector<PrimRefMB>& prims = *set.prims;
            const size_t begin = set.begin();
            const size_t end   = set.end();
            
            PrimInfoMB left(empty);
            PrimInfoMB right(empty);
            unsigned int geomID = prims[begin].geomID();
            size_t center = serial_partitioning(prims.data(),begin,end,left,right,
                                                [&] ( const PrimRefMB& prim ) { return prim.geomID() == geomID; },
                                                [ ] ( PrimInfoMB& dst, const PrimRefMB& prim ) { dst.add_primref(prim); });
            
            new (&lset) SetMB(left, set.prims,range<size_t>(begin,center),set.time_range);
            new (&rset) SetMB(right,set.prims,range<size_t>(center,end  ),set.time_range);
          }